

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

type __thiscall
dlib::
matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
::operator()(matrix_subtract_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
             *this,long r,long c)

{
  float fVar1;
  const_ret_type cVar2;
  
  fVar1 = (this->lhs->op).ptr[(this->lhs->op).stride * r + c];
  cVar2 = op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>
          ::apply(&this->rhs->op,r,c);
  return fVar1 - cVar2;
}

Assistant:

const type operator() (
            long r, 
            long c
        ) const { return lhs(r,c) - rhs(r,c); }